

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txout_txoutreference.cpp
# Opt level: O3

void __thiscall TxOutReference_Constractor_Test::TestBody(TxOutReference_Constractor_Test *this)

{
  undefined1 lhs [8];
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  int64_t satoshi;
  TxOutReference txout_ref;
  TxOut txout;
  undefined1 local_140 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [16];
  undefined1 local_120 [32];
  Script local_100;
  internal local_c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  bool local_a0;
  Script local_98;
  TxOut local_60;
  
  local_b8 = 1000000;
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(1000000);
  local_b0._0_8_ = AVar3.amount_;
  local_b0[8] = AVar3.ignore_check_;
  cfd::core::TxOut::TxOut(&local_60,(Amount *)local_b0,&exp_script);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_b0,&local_60);
  local_140._1_7_ = local_b0._9_7_;
  local_140[0] = (internal)local_b0[8];
  local_138.ptr_._0_1_ = local_a0;
  local_120._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)local_140);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_100,"txout_ref.GetValue().GetSatoshiValue()","satoshi",
             (long *)local_120,&local_b8);
  if ((char)local_100._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_140);
    if (local_100.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_100.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txout_txoutreference.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_120,(Message *)local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_120);
    if (local_140 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_140 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_140 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script(&local_100,&local_98);
  bVar1 = cfd::core::Script::IsEmpty(&local_100);
  local_120[0] = bVar1;
  local_c8[0] = (internal)0x0;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_140,"txout_ref.GetLockingScript().IsEmpty()","false",
             (bool *)local_120,(bool *)local_c8);
  cfd::core::Script::~Script(&local_100);
  if (local_140[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if ((undefined8 *)CONCAT71(local_138.ptr_._1_7_,local_138.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(local_138.ptr_._1_7_,local_138.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txout_txoutreference.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_120,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_120);
    if (CONCAT71(local_100._vptr_Script._1_7_,(char)local_100._vptr_Script) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_100._vptr_Script._1_7_,(char)local_100._vptr_Script) != (long *)0x0
         )) {
        (**(code **)(*(long *)CONCAT71(local_100._vptr_Script._1_7_,(char)local_100._vptr_Script) +
                    8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script(&local_100,&local_98);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_140,&local_100);
  lhs = local_140;
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_120,&exp_script);
  testing::internal::CmpHelperSTREQ
            (local_c8,"txout_ref.GetLockingScript().GetHex().c_str()","exp_script.GetHex().c_str()",
             (char *)lhs,(char *)local_120._0_8_);
  if ((AssertHelperData *)local_120._0_8_ != (AssertHelperData *)(local_120 + 0x10)) {
    operator_delete((void *)local_120._0_8_);
  }
  if (local_140 != (undefined1  [8])local_130) {
    operator_delete((void *)local_140);
  }
  cfd::core::Script::~Script(&local_100);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txout_txoutreference.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_140,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_140);
    if (CONCAT71(local_100._vptr_Script._1_7_,(char)local_100._vptr_Script) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_100._vptr_Script._1_7_,(char)local_100._vptr_Script) != (long *)0x0
         )) {
        (**(code **)(*(long *)CONCAT71(local_100._vptr_Script._1_7_,(char)local_100._vptr_Script) +
                    8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b0._0_8_ = &PTR__AbstractTxOutReference_0067f008;
  cfd::core::Script::~Script(&local_98);
  local_60.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_00691588;
  cfd::core::Script::~Script(&local_60.super_AbstractTxOut.locking_script_);
  return;
}

Assistant:

TEST(TxOutReference, Constractor) {
  {
    int64_t satoshi = 1000000;
    TxOut txout(Amount::CreateBySatoshiAmount(satoshi), exp_script);
    TxOutReference txout_ref(txout);

    EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), satoshi);
    EXPECT_EQ(txout_ref.GetLockingScript().IsEmpty(), false);
    EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
                 exp_script.GetHex().c_str());
  }
}